

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O3

void __thiscall WithBlock::~WithBlock(WithBlock *this)

{
  ContextChange *pCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  ulong uVar4;
  
  if (this->pateq != (PatternEquation *)0x0) {
    PatternEquation::release(this->pateq);
  }
  ppCVar3 = (this->contvec).super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar2 = (this->contvec).super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 != ppCVar3) {
    uVar4 = 0;
    do {
      pCVar1 = ppCVar3[uVar4];
      if (pCVar1 != (ContextChange *)0x0) {
        (**(code **)(*(long *)pCVar1 + 8))(pCVar1);
        ppCVar3 = (this->contvec).
                  super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppCVar2 = (this->contvec).
                  super__Vector_base<ContextChange_*,_std::allocator<ContextChange_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppCVar2 - (long)ppCVar3 >> 3));
  }
  if (ppCVar3 != (pointer)0x0) {
    operator_delete(ppCVar3);
    return;
  }
  return;
}

Assistant:

WithBlock::~WithBlock(void)

{
  if (pateq != (PatternEquation *)0)
    PatternEquation::release(pateq);
  for(int4 i=0;i<contvec.size();++i) {
    delete contvec[i];
  }
}